

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O2

bool __thiscall ON_PolyEdgeCurve::ContainsAnyEdges(ON_PolyEdgeCurve *this)

{
  int iVar1;
  ON_PolyEdgeSegment *pOVar2;
  int segment_index;
  int iVar3;
  
  iVar1 = ON_PolyCurve::Count(&this->super_ON_PolyCurve);
  iVar3 = 0;
  segment_index = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
    segment_index = 0;
  }
  for (; iVar3 != segment_index; segment_index = segment_index + 1) {
    pOVar2 = SegmentCurve(this,segment_index);
    if ((pOVar2 != (ON_PolyEdgeSegment *)0x0) && (pOVar2->m_edge != (ON_BrepEdge *)0x0)) break;
  }
  return segment_index < iVar1;
}

Assistant:

bool ON_PolyEdgeCurve::ContainsAnyEdges() const
{
  int i, count = SegmentCount();
  for( i = 0; i < count; i++)
  {
    ON_PolyEdgeSegment* segment = SegmentCurve(i);
    if( 0 != segment && nullptr != segment->BrepEdge())
    {
      return true;
    }
  }
  return false;
}